

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O1

ptr<custom_notification_msg> __thiscall
nuraft::custom_notification_msg::deserialize(custom_notification_msg *this,buffer *buf)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  byte bVar4;
  element_type *peVar5;
  void *__src;
  byte *__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ptr<custom_notification_msg> pVar7;
  size_t buf_len;
  buffer_serializer bs;
  size_t local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  buffer_serializer local_38;
  
  *(undefined8 *)this = 0;
  peVar5 = (element_type *)operator_new(0x28);
  *(undefined8 *)(peVar5 + 8) = 0x100000001;
  *(undefined ***)peVar5 = &PTR___Sp_counted_ptr_inplace_005c21a8;
  *(undefined4 *)(peVar5 + 0x10) = 1;
  *(undefined8 *)(peVar5 + 0x18) = 0;
  *(undefined8 *)(peVar5 + 0x20) = 0;
  (this->ctx_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  *(element_type **)this = peVar5 + 0x10;
  buffer_serializer::buffer_serializer(&local_38,buf,LITTLE);
  buffer_serializer::get_u8(&local_38);
  bVar4 = buffer_serializer::get_u8(&local_38);
  *(uint *)(peVar5 + 0x10) = (uint)bVar4;
  local_50 = 0;
  __src = buffer_serializer::get_bytes(&local_38,&local_50);
  if (local_50 == 0) {
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar5 + 0x20);
    *(undefined8 *)(peVar5 + 0x18) = 0;
    *(undefined8 *)(peVar5 + 0x20) = 0;
    _Var6._M_pi = extraout_RDX;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      _Var6._M_pi = extraout_RDX_01;
    }
  }
  else {
    buffer::alloc((buffer *)&local_48,local_50);
    p_Var3 = p_Stack_40;
    uVar2 = local_48;
    local_48 = 0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar5 + 0x20);
    *(undefined8 *)(peVar5 + 0x18) = uVar2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar5 + 0x20) = p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    __dest = buffer::data_begin(*(buffer **)(peVar5 + 0x18));
    memcpy(__dest,__src,local_50);
    _Var6._M_pi = extraout_RDX_00;
  }
  pVar7.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (ptr<custom_notification_msg>)
         pVar7.super___shared_ptr<nuraft::custom_notification_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<custom_notification_msg> custom_notification_msg::deserialize(buffer& buf) {
    ptr<custom_notification_msg> ret = cs_new<custom_notification_msg>();

    buffer_serializer bs(buf);
    uint8_t version = bs.get_u8();
    (void)version;
    ret->type_ = static_cast<custom_notification_msg::type>(bs.get_u8());

    size_t buf_len = 0;
    void* ptr = bs.get_bytes(buf_len);

    if (buf_len) {
        ret->ctx_ = buffer::alloc(buf_len);
        memcpy(ret->ctx_->data_begin(), ptr, buf_len);
    } else {
        ret->ctx_ = nullptr;
    }

    return ret;
}